

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int *piVar1;
  jpeg_entropy_decoder *pjVar2;
  JBLOCKROW paJVar3;
  jpeg_error_mgr *pjVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uchar *st;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar1 = (int *)((long)&pjVar2[3].start_pass + 4);
    *piVar1 = *piVar1 + -1;
  }
  if ((pjVar2[1].insufficient_data != -1) && (iVar11 = cinfo->Ss, iVar11 <= cinfo->Se)) {
    paJVar3 = *MCU_data;
    lVar8 = (long)cinfo->cur_comp_info[0]->ac_tbl_no;
    do {
      lVar9 = *(long *)(&pjVar2[8].insufficient_data + lVar8 * 2);
      lVar14 = (long)(iVar11 * 3 + -3);
      iVar5 = arith_decode(cinfo,(uchar *)(lVar9 + lVar14));
      if (iVar5 != 0) {
        return 1;
      }
      st = (uchar *)(lVar14 + lVar9 + 2);
      lVar9 = 0;
      while (iVar5 = arith_decode(cinfo,st + -1), iVar5 == 0) {
        st = st + 3;
        lVar9 = lVar9 + 1;
        if (cinfo->Se <= iVar11 + -1 + (int)lVar9) goto LAB_0012b6a5;
      }
      iVar5 = arith_decode(cinfo,(uchar *)(pjVar2 + 0xe));
      iVar6 = arith_decode(cinfo,st);
      iVar12 = iVar11 + (int)lVar9;
      if (iVar6 == 0) {
        uVar13 = 0;
      }
      else {
        iVar6 = arith_decode(cinfo,st);
        if (iVar6 == 0) {
          uVar13 = 1;
        }
        else {
          lVar14 = 0xbd;
          if ((int)(uint)cinfo->arith_ac_K[lVar8] < iVar12) {
            lVar14 = 0xd9;
          }
          st = (uchar *)(lVar14 + *(long *)(&pjVar2[8].insufficient_data + lVar8 * 2));
          iVar6 = arith_decode(cinfo,st);
          uVar13 = 2;
          while (iVar6 != 0) {
            uVar13 = uVar13 * 2;
            if (uVar13 == 0x8000) {
LAB_0012b6a5:
              pjVar4 = cinfo->err;
              pjVar4->msg_code = 0x7e;
              (*pjVar4->emit_message)((j_common_ptr)cinfo,-1);
              pjVar2[1].insufficient_data = -1;
              return 1;
            }
            st = st + 1;
            iVar6 = arith_decode(cinfo,st);
          }
        }
      }
      uVar10 = uVar13;
      if (1 < uVar13) {
        do {
          uVar13 = (int)uVar13 >> 1;
          uVar7 = arith_decode(cinfo,st + 0xe);
          if (uVar7 != 0) {
            uVar7 = uVar13;
          }
          uVar10 = uVar10 | uVar7;
        } while (1 < uVar13);
      }
      uVar13 = ~uVar10;
      if (iVar5 == 0) {
        uVar13 = uVar10 + 1;
      }
      (*paJVar3)[jpeg_natural_order[iVar11 + lVar9]] = (JCOEF)(uVar13 << ((byte)cinfo->Al & 0x1f));
      iVar11 = iVar11 + (int)lVar9 + 1;
    } while (iVar12 < cinfo->Se);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, sign, k;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

  /* Figure F.20: Decode_AC_coefficients */
  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (arith_decode(cinfo, st)) break;         /* EOB flag */
    while (arith_decode(cinfo, st + 1) == 0) {
      st += 3;  k++;
      if (k > cinfo->Se) {
        WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
        entropy->ct = -1;                       /* spectral overflow */
        return TRUE;
      }
    }
    /* Figure F.21: Decoding nonzero value v */
    /* Figure F.22: Decoding the sign of v */
    sign = arith_decode(cinfo, entropy->fixed_bin);
    st += 2;
    /* Figure F.23: Decoding the magnitude category of v */
    if ((m = arith_decode(cinfo, st)) != 0) {
      if (arith_decode(cinfo, st)) {
        m <<= 1;
        st = entropy->ac_stats[tbl] +
             (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
    }
    v = m;
    /* Figure F.24: Decoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      if (arith_decode(cinfo, st)) v |= m;
    v += 1;  if (sign) v = -v;
    /* Scale and output coefficient in natural (dezigzagged) order */
    (*block)[jpeg_natural_order[k]] = (JCOEF)((unsigned)v << cinfo->Al);
  }

  return TRUE;
}